

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsReport.cpp
# Opt level: O0

void KDReports::Report::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  void *_v_1;
  Report *_t_2;
  QString *local_40;
  void *_v;
  Report *_t_1;
  int *result;
  Report *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (Report *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    if (_id == 0) {
      printingProgress((Report *)_o,*_a[1]);
    }
    else if (_id == 1) {
      documentNameChanged((Report *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == printingProgress && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    else {
      pcVar1 = *_a[1];
      if (pcVar1 == documentNameChanged &&
          (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 1;
      }
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (QString *)*_a;
    if (_id == 0) {
      _v = _o;
      documentName((QString *)&_t_2,(Report *)_o);
      QString::operator=(local_40,(QString *)&_t_2);
      QString::~QString((QString *)&_t_2);
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    setDocumentName((Report *)_o,(QString *)*_a);
  }
  return;
}

Assistant:

void KDReports::Report::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->printingProgress((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->documentNameChanged(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Report::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Report::printingProgress)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Report::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Report::documentNameChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->documentName(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Report *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDocumentName(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}